

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O3

void __thiscall QPDFPageDocumentHelper::removeUnreferencedResources(QPDFPageDocumentHelper *this)

{
  QPDFPageObjectHelper *ph;
  pointer this_00;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_28;
  
  getAllPages(&local_28,this);
  for (this_00 = local_28.
                 super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_28.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    QPDFPageObjectHelper::removeUnreferencedResources(this_00);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_28);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::removeUnreferencedResources()
{
    for (auto& ph: getAllPages()) {
        ph.removeUnreferencedResources();
    }
}